

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O3

void SHA1_Transform(SHA_CTX *c,uchar *data)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  
  uVar1 = c->h0;
  uVar13 = c->h1;
  uVar16 = c->h2;
  uVar15 = *(uint *)(data + 0xc);
  uVar6 = *(uint *)(data + 8);
  uVar30 = *(uint *)(data + 0x28);
  uVar4 = uVar13 >> 2 | uVar13 << 0x1e;
  uVar7 = (uVar13 & uVar16 | ~uVar13 & c->h3) + 0x5a827999 +
          (uVar1 >> 0x1b | uVar1 << 5) + *(uint *)data + c->h4;
  uVar19 = uVar1 >> 2 | uVar1 << 0x1e;
  uVar13 = *(uint *)(data + 0x24);
  uVar5 = (uVar4 & uVar1 | ~uVar1 & uVar16) + *(uint *)(data + 4) + c->h3 + 0x5a827999 +
          (uVar7 >> 0x1b | uVar7 * 0x20);
  uVar10 = uVar7 >> 2 | uVar7 * 0x40000000;
  uVar8 = uVar5 >> 2 | uVar5 * 0x40000000;
  uVar7 = (uVar5 >> 0x1b | uVar5 * 0x20) + (uVar19 & uVar7 | ~uVar7 & uVar4) + uVar6 + uVar16 +
          0x5a827999;
  uVar16 = *(uint *)(data + 0x10);
  uVar5 = (uVar5 & uVar10 | ~uVar5 & uVar19) + uVar15 + uVar4 + 0x5a827999 +
          (uVar7 >> 0x1b | uVar7 * 0x20);
  uVar20 = uVar5 >> 2 | uVar5 * 0x40000000;
  uVar25 = uVar7 >> 2 | uVar7 * 0x40000000;
  uVar4 = *(uint *)(data + 0x14);
  uVar19 = (uVar5 >> 0x1b | uVar5 * 0x20) + (uVar8 & uVar7 | ~uVar7 & uVar10) + uVar16 + uVar19 +
           0x5a827999;
  uVar17 = uVar19 >> 2 | uVar19 * 0x40000000;
  uVar10 = (uVar5 & uVar25 | ~uVar5 & uVar8) + uVar10 + uVar4 + 0x5a827999 +
           (uVar19 >> 0x1b | uVar19 * 0x20);
  uVar5 = *(uint *)(data + 0x18);
  uVar14 = uVar10 >> 2 | uVar10 * 0x40000000;
  uVar7 = *(uint *)(data + 0x1c);
  uVar19 = (uVar10 >> 0x1b | uVar10 * 0x20) + (uVar19 & uVar20 | ~uVar19 & uVar25) + uVar8 + uVar5 +
           0x5a827999;
  uVar8 = (uVar10 & uVar17 | ~uVar10 & uVar20) + uVar7 + uVar25 + 0x5a827999 +
          (uVar19 >> 0x1b | uVar19 * 0x20);
  uVar25 = uVar19 >> 2 | uVar19 * 0x40000000;
  uVar10 = *(uint *)(data + 0x20);
  uVar21 = uVar8 >> 2 | uVar8 * 0x40000000;
  uVar20 = (uVar8 >> 0x1b | uVar8 * 0x20) + (uVar19 & uVar14 | ~uVar19 & uVar17) + uVar20 + uVar10 +
           0x5a827999;
  uVar31 = uVar20 >> 2 | uVar20 * 0x40000000;
  uVar17 = (uVar8 & uVar25 | ~uVar8 & uVar14) + uVar13 + uVar17 + 0x5a827999 +
           (uVar20 >> 0x1b | uVar20 * 0x20);
  uVar8 = *(uint *)(data + 0x34);
  uVar26 = uVar17 >> 2 | uVar17 * 0x40000000;
  uVar19 = *(uint *)(data + 0x2c);
  uVar12 = uVar10 ^ uVar8 ^ *(uint *)data ^ uVar6;
  uVar9 = (uVar17 >> 0x1b | uVar17 * 0x20) + (uVar20 & uVar21 | ~uVar20 & uVar25) + uVar30 + uVar14
          + 0x5a827999;
  uVar20 = (uVar17 & uVar31 | ~uVar17 & uVar21) + uVar25 + uVar19 + 0x5a827999 +
           (uVar9 >> 0x1b | uVar9 * 0x20);
  uVar17 = *(uint *)(data + 0x38);
  uVar11 = uVar9 >> 2 | uVar9 * 0x40000000;
  uVar18 = uVar13 ^ uVar17 ^ *(uint *)(data + 4) ^ uVar15;
  uVar25 = *(uint *)(data + 0x30);
  uVar14 = *(uint *)(data + 0x3c);
  uVar22 = (uVar20 >> 0x1b | uVar20 * 0x20) + (uVar9 & uVar26 | ~uVar9 & uVar31) + uVar25 + uVar21 +
           0x5a827999;
  uVar21 = uVar30 ^ uVar14 ^ uVar6 ^ uVar16;
  uVar9 = uVar20 >> 2 | uVar20 * 0x40000000;
  uVar28 = uVar22 >> 2 | uVar22 * 0x40000000;
  uVar6 = (uVar20 & uVar11 | ~uVar20 & uVar26) + uVar8 + uVar31 + 0x5a827999 +
          (uVar22 >> 0x1b | uVar22 * 0x20);
  uVar31 = uVar12 >> 0x1f | uVar12 << 1;
  uVar23 = uVar6 >> 2 | uVar6 * 0x40000000;
  uVar20 = (uVar6 >> 0x1b | uVar6 * 0x20) + (uVar22 & uVar9 | ~uVar22 & uVar11) + uVar17 + uVar26 +
           0x5a827999;
  uVar22 = uVar20 >> 2 | uVar20 * 0x40000000;
  uVar6 = (uVar6 & uVar28 | ~uVar6 & uVar9) + uVar11 + uVar14 + 0x5a827999 +
          (uVar20 >> 0x1b | uVar20 * 0x20);
  uVar18 = uVar18 >> 0x1f | uVar18 << 1;
  uVar12 = uVar6 >> 2 | uVar6 * 0x40000000;
  uVar9 = (uVar6 >> 0x1b | uVar6 * 0x20) + (uVar20 & uVar23 | ~uVar20 & uVar28) + uVar31 + uVar9 +
          0x5a827999;
  uVar6 = (uVar6 & uVar22 | ~uVar6 & uVar23) + uVar18 + uVar28 + 0x5a827999 +
          (uVar9 >> 0x1b | uVar9 * 0x20);
  uVar20 = uVar9 >> 2 | uVar9 * 0x40000000;
  uVar21 = uVar21 >> 0x1f | uVar21 << 1;
  uVar11 = uVar6 >> 2 | uVar6 * 0x40000000;
  uVar9 = (uVar6 >> 0x1b | uVar6 * 0x20) + (uVar9 & uVar12 | ~uVar9 & uVar22) + uVar21 + uVar23 +
          0x5a827999;
  uVar15 = uVar15 ^ uVar4 ^ uVar19 ^ uVar31;
  uVar29 = uVar15 >> 0x1f | uVar15 << 1;
  uVar23 = uVar9 >> 2 | uVar9 * 0x40000000;
  uVar15 = (uVar6 & uVar20 | ~uVar6 & uVar12) + uVar29 + uVar22 + 0x5a827999 +
           (uVar9 >> 0x1b | uVar9 * 0x20);
  uVar6 = uVar4 ^ uVar7 ^ uVar8 ^ uVar21;
  uVar33 = uVar6 >> 0x1f | uVar6 << 1;
  uVar16 = uVar16 ^ uVar5 ^ uVar25 ^ uVar18;
  uVar22 = uVar16 >> 0x1f | uVar16 << 1;
  uVar6 = (uVar20 ^ uVar11 ^ uVar9) + uVar22 + uVar12 + 0x6ed9eba1 +
          (uVar15 >> 0x1b | uVar15 * 0x20);
  uVar16 = uVar5 ^ uVar10 ^ uVar17 ^ uVar29;
  uVar9 = uVar16 >> 0x1f | uVar16 << 1;
  uVar16 = uVar15 >> 2 | uVar15 * 0x40000000;
  uVar15 = (uVar11 ^ uVar23 ^ uVar15) + uVar33 + uVar20 + 0x6ed9eba1 +
           (uVar6 >> 0x1b | uVar6 * 0x20);
  uVar4 = uVar7 ^ uVar13 ^ uVar14 ^ uVar22;
  uVar20 = uVar4 >> 0x1f | uVar4 << 1;
  uVar4 = uVar6 >> 2 | uVar6 * 0x40000000;
  uVar5 = (uVar23 ^ uVar16 ^ uVar6) + uVar9 + uVar11 + 0x6ed9eba1 + (uVar15 >> 0x1b | uVar15 * 0x20)
  ;
  uVar6 = uVar10 ^ uVar30 ^ uVar31 ^ uVar33;
  uVar11 = uVar6 >> 0x1f | uVar6 << 1;
  uVar6 = uVar15 >> 2 | uVar15 * 0x40000000;
  uVar15 = (uVar16 ^ uVar4 ^ uVar15) + uVar20 + uVar23 + 0x6ed9eba1 + (uVar5 >> 0x1b | uVar5 * 0x20)
  ;
  uVar13 = uVar13 ^ uVar19 ^ uVar18 ^ uVar9;
  uVar12 = uVar13 >> 0x1f | uVar13 << 1;
  uVar13 = (uVar4 ^ uVar6 ^ uVar5) + uVar11 + uVar16 + 0x6ed9eba1 + (uVar15 >> 0x1b | uVar15 * 0x20)
  ;
  uVar16 = uVar30 ^ uVar25 ^ uVar21 ^ uVar20;
  uVar7 = uVar5 >> 2 | uVar5 * 0x40000000;
  uVar30 = uVar15 >> 2 | uVar15 * 0x40000000;
  uVar23 = uVar16 >> 0x1f | uVar16 << 1;
  uVar16 = (uVar6 ^ uVar7 ^ uVar15) + uVar12 + uVar4 + 0x6ed9eba1 + (uVar13 >> 0x1b | uVar13 * 0x20)
  ;
  uVar15 = uVar19 ^ uVar8 ^ uVar29 ^ uVar11;
  uVar28 = uVar15 >> 0x1f | uVar15 << 1;
  uVar10 = (uVar7 ^ uVar30 ^ uVar13) + uVar23 + uVar6 + 0x6ed9eba1 +
           (uVar16 >> 0x1b | uVar16 * 0x20);
  uVar19 = uVar13 >> 2 | uVar13 * 0x40000000;
  uVar13 = uVar25 ^ uVar17 ^ uVar22 ^ uVar12;
  uVar6 = uVar17 ^ uVar31 ^ uVar9 ^ uVar28;
  uVar5 = uVar13 >> 0x1f | uVar13 << 1;
  uVar15 = uVar16 >> 2 | uVar16 * 0x40000000;
  uVar4 = (uVar30 ^ uVar19 ^ uVar16) + uVar28 + uVar7 + 0x6ed9eba1 +
          (uVar10 >> 0x1b | uVar10 * 0x20);
  uVar13 = uVar8 ^ uVar14 ^ uVar33 ^ uVar23;
  uVar13 = uVar13 >> 0x1f | uVar13 << 1;
  uVar25 = uVar10 >> 2 | uVar10 * 0x40000000;
  uVar16 = uVar6 >> 0x1f | uVar6 << 1;
  uVar7 = (uVar19 ^ uVar15 ^ uVar10) + uVar5 + uVar30 + 0x6ed9eba1 + (uVar4 >> 0x1b | uVar4 * 0x20);
  uVar8 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar6 = (uVar15 ^ uVar25 ^ uVar4) + uVar13 + uVar19 + 0x6ed9eba1 + (uVar7 >> 0x1b | uVar7 * 0x20);
  uVar30 = uVar14 ^ uVar18 ^ uVar20 ^ uVar5;
  uVar4 = uVar18 ^ uVar29 ^ uVar12 ^ uVar16;
  uVar19 = uVar30 >> 0x1f | uVar30 << 1;
  uVar26 = uVar4 >> 0x1f | uVar4 << 1;
  uVar14 = (uVar25 ^ uVar8 ^ uVar7) + uVar16 + uVar15 + 0x6ed9eba1 + (uVar6 >> 0x1b | uVar6 * 0x20);
  uVar15 = uVar31 ^ uVar21 ^ uVar11 ^ uVar13;
  uVar4 = uVar7 >> 2 | uVar7 * 0x40000000;
  uVar10 = uVar15 >> 0x1f | uVar15 << 1;
  uVar15 = uVar21 ^ uVar22 ^ uVar23 ^ uVar19;
  uVar15 = uVar15 >> 0x1f | uVar15 << 1;
  uVar7 = uVar29 ^ uVar33 ^ uVar28 ^ uVar10;
  uVar30 = uVar6 >> 2 | uVar6 * 0x40000000;
  uVar17 = uVar7 >> 0x1f | uVar7 << 1;
  uVar6 = (uVar8 ^ uVar4 ^ uVar6) + uVar19 + uVar25 + 0x6ed9eba1 + (uVar14 >> 0x1b | uVar14 * 0x20);
  uVar7 = (uVar4 ^ uVar30 ^ uVar14) + uVar10 + uVar8 + 0x6ed9eba1 + (uVar6 >> 0x1b | uVar6 * 0x20);
  uVar8 = uVar14 >> 2 | uVar14 * 0x40000000;
  uVar25 = uVar6 >> 2 | uVar6 * 0x40000000;
  uVar6 = (uVar30 ^ uVar8 ^ uVar6) + uVar26 + uVar4 + 0x6ed9eba1 + (uVar7 >> 0x1b | uVar7 * 0x20);
  uVar4 = uVar7 >> 2 | uVar7 * 0x40000000;
  uVar7 = (uVar8 ^ uVar25 ^ uVar7) + uVar15 + uVar30 + 0x6ed9eba1 + (uVar6 >> 0x1b | uVar6 * 0x20);
  uVar30 = uVar22 ^ uVar9 ^ uVar5 ^ uVar26;
  uVar21 = uVar30 >> 0x1f | uVar30 << 1;
  uVar30 = uVar6 >> 2 | uVar6 * 0x40000000;
  uVar8 = (uVar25 ^ uVar4 ^ uVar6) + uVar17 + uVar8 + 0x6ed9eba1 + (uVar7 >> 0x1b | uVar7 * 0x20);
  uVar6 = uVar33 ^ uVar20 ^ uVar13 ^ uVar15;
  uVar29 = uVar6 >> 0x1f | uVar6 << 1;
  uVar14 = uVar7 >> 2 | uVar7 * 0x40000000;
  uVar7 = (uVar4 ^ uVar30 ^ uVar7) + uVar21 + uVar25 + 0x6ed9eba1 + (uVar8 >> 0x1b | uVar8 * 0x20);
  uVar6 = uVar9 ^ uVar11 ^ uVar16 ^ uVar17;
  uVar31 = uVar6 >> 0x1f | uVar6 << 1;
  uVar6 = (uVar30 ^ uVar14 ^ uVar8) + uVar29 + uVar4 + 0x6ed9eba1 + (uVar7 >> 0x1b | uVar7 * 0x20);
  uVar4 = uVar20 ^ uVar12 ^ uVar19 ^ uVar21;
  uVar25 = uVar4 >> 0x1f | uVar4 << 1;
  uVar8 = uVar8 >> 2 | uVar8 * 0x40000000;
  uVar4 = uVar7 >> 2 | uVar7 * 0x40000000;
  uVar9 = (uVar14 ^ uVar8 ^ uVar7) + uVar31 + uVar30 + 0x6ed9eba1 + (uVar6 >> 0x1b | uVar6 * 0x20);
  uVar32 = uVar9 >> 2 | uVar9 * 0x40000000;
  uVar30 = uVar11 ^ uVar23 ^ uVar10 ^ uVar29;
  uVar18 = uVar30 >> 0x1f | uVar30 << 1;
  uVar7 = (uVar8 ^ uVar4 ^ uVar6) + uVar25 + uVar14 + 0x6ed9eba1 + (uVar9 >> 0x1b | uVar9 * 0x20);
  uVar20 = uVar6 >> 2 | uVar6 * 0x40000000;
  uVar6 = uVar12 ^ uVar28 ^ uVar26 ^ uVar31;
  uVar30 = uVar7 >> 2 | uVar7 * 0x40000000;
  uVar33 = uVar6 >> 0x1f | uVar6 << 1;
  uVar8 = (uVar7 >> 0x1b | uVar7 * 0x20) + 0x8f1bbcdc +
          (uVar9 & uVar20 | (uVar9 | uVar20) & uVar4) + uVar18 + uVar8;
  uVar14 = uVar8 >> 2 | uVar8 * 0x40000000;
  iVar27 = (uVar8 >> 0x1b | uVar8 * 0x20) +
           (uVar7 & uVar32 | (uVar7 | uVar32) & uVar20) + uVar4 + uVar33;
  uVar11 = iVar27 + 0x8f1bbcdc;
  uVar6 = uVar23 ^ uVar5 ^ uVar15 ^ uVar25;
  uVar22 = uVar6 >> 0x1f | uVar6 << 1;
  uVar9 = uVar11 >> 2 | iVar27 * 0x40000000;
  uVar6 = uVar28 ^ uVar13 ^ uVar17 ^ uVar18;
  iVar27 = (uVar11 >> 0x1b | uVar11 * 0x20) +
           (uVar8 & uVar30 | (uVar8 | uVar30) & uVar32) + uVar22 + uVar20;
  uVar4 = uVar6 >> 0x1f | uVar6 << 1;
  uVar7 = iVar27 + 0x8f1bbcdc;
  iVar24 = (uVar7 >> 0x1b | uVar7 * 0x20) +
           (uVar11 & uVar14 | (uVar11 | uVar14) & uVar30) + uVar4 + uVar32;
  uVar12 = uVar7 >> 2 | iVar27 * 0x40000000;
  uVar11 = iVar24 + 0x8f1bbcdc;
  uVar6 = uVar5 ^ uVar16 ^ uVar21 ^ uVar33;
  uVar5 = uVar6 >> 0x1f | uVar6 << 1;
  uVar8 = uVar11 >> 2 | iVar24 * 0x40000000;
  iVar27 = (uVar11 >> 0x1b | uVar11 * 0x20) +
           (uVar7 & uVar9 | (uVar7 | uVar9) & uVar14) + uVar30 + uVar5;
  uVar6 = iVar27 + 0x8f1bbcdc;
  uVar13 = uVar13 ^ uVar19 ^ uVar29 ^ uVar22;
  uVar7 = uVar13 >> 0x1f | uVar13 << 1;
  uVar20 = uVar6 >> 2 | iVar27 * 0x40000000;
  iVar27 = (uVar6 >> 0x1b | uVar6 * 0x20) +
           (uVar11 & uVar12 | (uVar11 | uVar12) & uVar9) + uVar7 + uVar14;
  uVar11 = iVar27 + 0x8f1bbcdc;
  uVar13 = uVar16 ^ uVar10 ^ uVar31 ^ uVar4;
  uVar28 = uVar13 >> 0x1f | uVar13 << 1;
  uVar13 = uVar11 >> 2 | iVar27 * 0x40000000;
  iVar27 = (uVar11 >> 0x1b | uVar11 * 0x20) +
           (uVar6 & uVar8 | (uVar6 | uVar8) & uVar12) + uVar28 + uVar9;
  uVar14 = iVar27 + 0x8f1bbcdc;
  uVar16 = uVar19 ^ uVar26 ^ uVar25 ^ uVar5;
  uVar6 = uVar16 >> 0x1f | uVar16 << 1;
  uVar30 = uVar14 >> 2 | iVar27 * 0x40000000;
  iVar27 = (uVar14 >> 0x1b | uVar14 * 0x20) +
           (uVar11 & uVar20 | (uVar11 | uVar20) & uVar8) + uVar6 + uVar12;
  uVar16 = uVar10 ^ uVar15 ^ uVar18 ^ uVar7;
  uVar19 = iVar27 + 0x8f1bbcdc;
  uVar10 = uVar16 >> 0x1f | uVar16 << 1;
  iVar24 = (uVar19 >> 0x1b | uVar19 * 0x20) +
           (uVar14 & uVar13 | (uVar14 | uVar13) & uVar20) + uVar10 + uVar8;
  uVar12 = uVar19 >> 2 | iVar27 * 0x40000000;
  uVar11 = iVar24 + 0x8f1bbcdc;
  uVar16 = uVar26 ^ uVar17 ^ uVar33 ^ uVar28;
  uVar8 = uVar16 >> 0x1f | uVar16 << 1;
  uVar16 = uVar15 ^ uVar21 ^ uVar22 ^ uVar6;
  uVar9 = uVar11 >> 2 | iVar24 * 0x40000000;
  iVar27 = (uVar11 >> 0x1b | uVar11 * 0x20) +
           (uVar19 & uVar30 | (uVar19 | uVar30) & uVar13) + uVar20 + uVar8;
  uVar14 = iVar27 + 0x8f1bbcdc;
  uVar19 = uVar16 >> 0x1f | uVar16 << 1;
  uVar16 = uVar14 >> 2 | iVar27 * 0x40000000;
  iVar27 = (uVar14 >> 0x1b | uVar14 * 0x20) +
           (uVar11 & uVar12 | (uVar11 | uVar12) & uVar30) + uVar13 + uVar19;
  uVar13 = uVar17 ^ uVar29 ^ uVar4 ^ uVar10;
  uVar17 = uVar13 >> 0x1f | uVar13 << 1;
  uVar20 = iVar27 + 0x8f1bbcdc;
  uVar15 = uVar20 >> 2 | iVar27 * 0x40000000;
  iVar27 = (uVar20 >> 0x1b | uVar20 * 0x20) +
           (uVar14 & uVar9 | (uVar14 | uVar9) & uVar12) + uVar30 + uVar17;
  uVar13 = uVar21 ^ uVar31 ^ uVar5 ^ uVar8;
  uVar11 = uVar13 >> 0x1f | uVar13 << 1;
  uVar14 = iVar27 + 0x8f1bbcdc;
  uVar21 = uVar14 >> 2 | iVar27 * 0x40000000;
  iVar27 = (uVar14 >> 0x1b | uVar14 * 0x20) +
           (uVar20 & uVar16 | (uVar20 | uVar16) & uVar9) + uVar12 + uVar11;
  uVar30 = iVar27 + 0x8f1bbcdc;
  uVar13 = uVar29 ^ uVar25 ^ uVar7 ^ uVar19;
  uVar29 = uVar13 >> 0x1f | uVar13 << 1;
  uVar20 = uVar30 >> 2 | iVar27 * 0x40000000;
  uVar13 = uVar31 ^ uVar18 ^ uVar28 ^ uVar17;
  iVar27 = (uVar30 >> 0x1b | uVar30 * 0x20) +
           (uVar14 & uVar15 | (uVar14 | uVar15) & uVar16) + uVar9 + uVar29;
  uVar23 = uVar13 >> 0x1f | uVar13 << 1;
  uVar14 = iVar27 + 0x8f1bbcdc;
  uVar12 = uVar14 >> 2 | iVar27 * 0x40000000;
  iVar27 = (uVar14 >> 0x1b | uVar14 * 0x20) +
           (uVar30 & uVar21 | (uVar30 | uVar21) & uVar15) + uVar16 + uVar23;
  uVar13 = iVar27 + 0x8f1bbcdc;
  uVar16 = uVar25 ^ uVar33 ^ uVar6 ^ uVar11;
  uVar31 = uVar16 >> 0x1f | uVar16 << 1;
  uVar16 = uVar13 >> 2 | iVar27 * 0x40000000;
  iVar27 = (uVar13 >> 0x1b | uVar13 * 0x20) +
           (uVar14 & uVar20 | (uVar14 | uVar20) & uVar21) + uVar15 + uVar31;
  uVar25 = iVar27 + 0x8f1bbcdc;
  uVar15 = uVar18 ^ uVar22 ^ uVar10 ^ uVar29;
  uVar14 = uVar15 >> 0x1f | uVar15 << 1;
  uVar9 = uVar25 >> 2 | iVar27 * 0x40000000;
  iVar27 = (uVar25 >> 0x1b | uVar25 * 0x20) +
           (uVar13 & uVar12 | (uVar13 | uVar12) & uVar20) + uVar21 + uVar14;
  uVar30 = iVar27 + 0x8f1bbcdc;
  uVar13 = uVar33 ^ uVar4 ^ uVar8 ^ uVar23;
  uVar21 = uVar13 >> 0x1f | uVar13 << 1;
  uVar13 = uVar30 >> 2 | iVar27 * 0x40000000;
  iVar27 = (uVar30 >> 0x1b | uVar30 * 0x20) +
           (uVar25 & uVar16 | (uVar25 | uVar16) & uVar12) + uVar21 + uVar20;
  uVar25 = iVar27 + 0x8f1bbcdc;
  uVar15 = uVar22 ^ uVar5 ^ uVar19 ^ uVar31;
  uVar22 = uVar15 >> 0x1f | uVar15 << 1;
  uVar20 = uVar25 >> 2 | iVar27 * 0x40000000;
  iVar24 = (uVar25 >> 0x1b | uVar25 * 0x20) +
           (uVar30 & uVar9 | (uVar30 | uVar9) & uVar16) + uVar22 + uVar12;
  uVar15 = uVar4 ^ uVar7 ^ uVar17 ^ uVar14;
  uVar12 = uVar15 >> 0x1f | uVar15 << 1;
  uVar30 = iVar24 + 0x8f1bbcdc;
  iVar27 = (uVar30 >> 0x1b | uVar30 * 0x20) +
           (uVar25 & uVar13 | (uVar25 | uVar13) & uVar9) + uVar16 + uVar12;
  uVar15 = iVar27 + 0x8f1bbcdc;
  uVar16 = uVar5 ^ uVar28 ^ uVar11 ^ uVar21;
  uVar18 = uVar16 >> 0x1f | uVar16 << 1;
  uVar16 = uVar7 ^ uVar6 ^ uVar29 ^ uVar22;
  uVar25 = uVar16 >> 0x1f | uVar16 << 1;
  uVar4 = uVar30 >> 2 | iVar24 * 0x40000000;
  uVar16 = (uVar13 ^ uVar20 ^ uVar30) + uVar18 + uVar9 + -0x359d3e2a +
           (uVar15 >> 0x1b | uVar15 * 0x20);
  uVar30 = uVar28 ^ uVar10 ^ uVar23 ^ uVar12;
  uVar26 = uVar30 >> 0x1f | uVar30 << 1;
  uVar9 = (uVar20 ^ uVar4 ^ uVar15) + uVar25 + uVar13 + -0x359d3e2a +
          (uVar16 >> 0x1b | uVar16 * 0x20);
  uVar13 = uVar6 ^ uVar8 ^ uVar31 ^ uVar18;
  uVar7 = uVar13 >> 0x1f | uVar13 << 1;
  uVar15 = uVar15 >> 2 | iVar27 * 0x40000000;
  uVar30 = (uVar4 ^ uVar15 ^ uVar16) + uVar26 + uVar20 + -0x359d3e2a +
           (uVar9 >> 0x1b | uVar9 * 0x20);
  uVar13 = uVar10 ^ uVar19 ^ uVar14 ^ uVar25;
  uVar28 = uVar13 >> 0x1f | uVar13 << 1;
  uVar16 = uVar16 >> 2 | uVar16 * 0x40000000;
  uVar4 = (uVar15 ^ uVar16 ^ uVar9) + uVar7 + uVar4 + -0x359d3e2a + (uVar30 >> 0x1b | uVar30 * 0x20)
  ;
  uVar13 = uVar8 ^ uVar17 ^ uVar21 ^ uVar26;
  uVar5 = uVar13 >> 0x1f | uVar13 << 1;
  uVar13 = uVar9 >> 2 | uVar9 * 0x40000000;
  uVar15 = (uVar16 ^ uVar13 ^ uVar30) + uVar28 + uVar15 + -0x359d3e2a +
           (uVar4 >> 0x1b | uVar4 * 0x20);
  uVar6 = uVar19 ^ uVar11 ^ uVar22 ^ uVar7;
  uVar20 = uVar6 >> 0x1f | uVar6 << 1;
  uVar6 = uVar30 >> 2 | uVar30 * 0x40000000;
  uVar16 = (uVar13 ^ uVar6 ^ uVar4) + uVar5 + uVar16 + -0x359d3e2a +
           (uVar15 >> 0x1b | uVar15 * 0x20);
  uVar8 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar30 = uVar17 ^ uVar29 ^ uVar12 ^ uVar28;
  uVar17 = uVar30 >> 0x1f | uVar30 << 1;
  uVar30 = (uVar6 ^ uVar8 ^ uVar15) + uVar20 + uVar13 + -0x359d3e2a +
           (uVar16 >> 0x1b | uVar16 * 0x20);
  uVar15 = uVar15 >> 2 | uVar15 * 0x40000000;
  uVar13 = uVar11 ^ uVar23 ^ uVar18 ^ uVar5;
  uVar10 = uVar13 >> 0x1f | uVar13 << 1;
  uVar6 = (uVar8 ^ uVar15 ^ uVar16) + uVar17 + uVar6 + -0x359d3e2a +
          (uVar30 >> 0x1b | uVar30 * 0x20);
  uVar13 = uVar29 ^ uVar31 ^ uVar25 ^ uVar20;
  uVar11 = uVar13 >> 0x1f | uVar13 << 1;
  uVar16 = uVar16 >> 2 | uVar16 * 0x40000000;
  uVar4 = uVar30 >> 2 | uVar30 * 0x40000000;
  uVar30 = (uVar15 ^ uVar16 ^ uVar30) + uVar10 + uVar8 + -0x359d3e2a +
           (uVar6 >> 0x1b | uVar6 * 0x20);
  uVar13 = uVar23 ^ uVar14 ^ uVar26 ^ uVar17;
  uVar9 = uVar13 >> 0x1f | uVar13 << 1;
  uVar15 = (uVar16 ^ uVar4 ^ uVar6) + uVar11 + uVar15 + -0x359d3e2a +
           (uVar30 >> 0x1b | uVar30 * 0x20);
  uVar13 = uVar6 >> 2 | uVar6 * 0x40000000;
  uVar6 = uVar31 ^ uVar21 ^ uVar7 ^ uVar10;
  uVar6 = uVar6 >> 0x1f | uVar6 << 1;
  uVar19 = uVar30 >> 2 | uVar30 * 0x40000000;
  uVar30 = (uVar4 ^ uVar13 ^ uVar30) + uVar9 + uVar16 + -0x359d3e2a +
           (uVar15 >> 0x1b | uVar15 * 0x20);
  uVar16 = uVar14 ^ uVar22 ^ uVar28 ^ uVar11;
  uVar8 = uVar16 >> 0x1f | uVar16 << 1;
  uVar14 = uVar12 ^ uVar25 ^ uVar17 ^ uVar8;
  uVar17 = uVar21 ^ uVar12 ^ uVar5 ^ uVar9;
  uVar16 = (uVar13 ^ uVar19 ^ uVar15) + uVar6 + uVar4 + -0x359d3e2a +
           (uVar30 >> 0x1b | uVar30 * 0x20);
  uVar4 = uVar17 >> 0x1f | uVar17 << 1;
  uVar17 = uVar18 ^ uVar26 ^ uVar10 ^ uVar4;
  uVar10 = uVar15 >> 2 | uVar15 * 0x40000000;
  uVar17 = uVar17 >> 0x1f | uVar17 << 1;
  uVar15 = uVar30 >> 2 | uVar30 * 0x40000000;
  uVar5 = uVar5 ^ uVar7 ^ uVar6 ^ uVar17;
  uVar30 = (uVar19 ^ uVar10 ^ uVar30) + uVar8 + uVar13 + -0x359d3e2a +
           (uVar16 >> 0x1b | uVar16 * 0x20);
  uVar6 = uVar22 ^ uVar18 ^ uVar20 ^ uVar6;
  uVar8 = uVar14 >> 0x1f | uVar14 << 1;
  uVar13 = uVar6 >> 0x1f | uVar6 << 1;
  uVar14 = uVar25 ^ uVar7 ^ uVar11 ^ uVar13;
  uVar25 = uVar28 ^ uVar26 ^ uVar9 ^ uVar8;
  uVar7 = uVar16 >> 2 | uVar16 * 0x40000000;
  uVar6 = (uVar10 ^ uVar15 ^ uVar16) + uVar4 + uVar19 + -0x359d3e2a +
          (uVar30 >> 0x1b | uVar30 * 0x20);
  uVar16 = (uVar15 ^ uVar7 ^ uVar30) + uVar13 + uVar10 + -0x359d3e2a +
           (uVar6 >> 0x1b | uVar6 * 0x20);
  uVar13 = uVar30 >> 2 | uVar30 * 0x40000000;
  uVar30 = uVar6 >> 2 | uVar6 * 0x40000000;
  uVar4 = (uVar7 ^ uVar13 ^ uVar6) + uVar8 + uVar15 + -0x359d3e2a + (uVar16 >> 0x1b | uVar16 * 0x20)
  ;
  uVar6 = uVar16 >> 2 | uVar16 * 0x40000000;
  uVar10 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar16 = (uVar13 ^ uVar30 ^ uVar16) + uVar17 + uVar7 + -0x359d3e2a +
           (uVar4 >> 0x1b | uVar4 * 0x20);
  uVar15 = uVar16 >> 2 | uVar16 * 0x40000000;
  uVar4 = (uVar30 ^ uVar6 ^ uVar4) + (uVar14 >> 0x1f | uVar14 << 1) + uVar13 + -0x359d3e2a +
          (uVar16 >> 0x1b | uVar16 * 0x20);
  uVar13 = (uVar6 ^ uVar10 ^ uVar16) + (uVar25 >> 0x1f | uVar25 << 1) + uVar30 + -0x359d3e2a +
           (uVar4 >> 0x1b | uVar4 * 0x20);
  auVar2 = vpinsrd_avx(ZEXT416(uVar13),uVar4 >> 2 | uVar4 * 0x40000000,1);
  auVar2 = vpinsrd_avx(auVar2,uVar15,2);
  auVar3 = vpinsrd_avx(auVar2,uVar10,3);
  auVar2._0_4_ = c->h1;
  auVar2._4_4_ = c->h2;
  auVar2._8_4_ = c->h3;
  auVar2._12_4_ = c->h4;
  auVar2 = vpaddd_avx(auVar3,auVar2);
  c->h0 = (uVar15 ^ uVar10 ^ uVar4) + (uVar5 >> 0x1f | uVar5 << 1) + uVar1 + uVar6 + -0x359d3e2a +
          (uVar13 >> 0x1b | uVar13 * 0x20);
  c->h1 = auVar2._0_4_;
  c->h2 = auVar2._4_4_;
  c->h3 = auVar2._8_4_;
  c->h4 = auVar2._12_4_;
  return;
}

Assistant:

void SHA1_Transform(uint32_t state[5], const uint8_t buffer[64]) {
  uint32_t a, b, c, d, e;
  typedef union {
    uint8_t c[64];
    uint32_t l[16];
  } CHAR64LONG16;
#ifdef SHA1HANDSOFF
  CHAR64LONG16 block[1]; /* use array to appear as a pointer */
  memcpy(block, buffer, 64);
#else
  /* The following had better never be used because it causes the
   * pointer-to-const buffer to be cast into a pointer to non-const.
   * And the result is written through.  I threw a "const" in, hoping
   * this will cause a diagnostic.
   */
  CHAR64LONG16 *block = (const CHAR64LONG16 *)buffer;
#endif
  /* Copy context->state[] to working vars */
  a = state[0];
  b = state[1];
  c = state[2];
  d = state[3];
  e = state[4];
  /* 4 rounds of 20 operations each. Loop unrolled. */
  R0(a, b, c, d, e, 0);
  R0(e, a, b, c, d, 1);
  R0(d, e, a, b, c, 2);
  R0(c, d, e, a, b, 3);
  R0(b, c, d, e, a, 4);
  R0(a, b, c, d, e, 5);
  R0(e, a, b, c, d, 6);
  R0(d, e, a, b, c, 7);
  R0(c, d, e, a, b, 8);
  R0(b, c, d, e, a, 9);
  R0(a, b, c, d, e, 10);
  R0(e, a, b, c, d, 11);
  R0(d, e, a, b, c, 12);
  R0(c, d, e, a, b, 13);
  R0(b, c, d, e, a, 14);
  R0(a, b, c, d, e, 15);
  R1(e, a, b, c, d, 16);
  R1(d, e, a, b, c, 17);
  R1(c, d, e, a, b, 18);
  R1(b, c, d, e, a, 19);
  R2(a, b, c, d, e, 20);
  R2(e, a, b, c, d, 21);
  R2(d, e, a, b, c, 22);
  R2(c, d, e, a, b, 23);
  R2(b, c, d, e, a, 24);
  R2(a, b, c, d, e, 25);
  R2(e, a, b, c, d, 26);
  R2(d, e, a, b, c, 27);
  R2(c, d, e, a, b, 28);
  R2(b, c, d, e, a, 29);
  R2(a, b, c, d, e, 30);
  R2(e, a, b, c, d, 31);
  R2(d, e, a, b, c, 32);
  R2(c, d, e, a, b, 33);
  R2(b, c, d, e, a, 34);
  R2(a, b, c, d, e, 35);
  R2(e, a, b, c, d, 36);
  R2(d, e, a, b, c, 37);
  R2(c, d, e, a, b, 38);
  R2(b, c, d, e, a, 39);
  R3(a, b, c, d, e, 40);
  R3(e, a, b, c, d, 41);
  R3(d, e, a, b, c, 42);
  R3(c, d, e, a, b, 43);
  R3(b, c, d, e, a, 44);
  R3(a, b, c, d, e, 45);
  R3(e, a, b, c, d, 46);
  R3(d, e, a, b, c, 47);
  R3(c, d, e, a, b, 48);
  R3(b, c, d, e, a, 49);
  R3(a, b, c, d, e, 50);
  R3(e, a, b, c, d, 51);
  R3(d, e, a, b, c, 52);
  R3(c, d, e, a, b, 53);
  R3(b, c, d, e, a, 54);
  R3(a, b, c, d, e, 55);
  R3(e, a, b, c, d, 56);
  R3(d, e, a, b, c, 57);
  R3(c, d, e, a, b, 58);
  R3(b, c, d, e, a, 59);
  R4(a, b, c, d, e, 60);
  R4(e, a, b, c, d, 61);
  R4(d, e, a, b, c, 62);
  R4(c, d, e, a, b, 63);
  R4(b, c, d, e, a, 64);
  R4(a, b, c, d, e, 65);
  R4(e, a, b, c, d, 66);
  R4(d, e, a, b, c, 67);
  R4(c, d, e, a, b, 68);
  R4(b, c, d, e, a, 69);
  R4(a, b, c, d, e, 70);
  R4(e, a, b, c, d, 71);
  R4(d, e, a, b, c, 72);
  R4(c, d, e, a, b, 73);
  R4(b, c, d, e, a, 74);
  R4(a, b, c, d, e, 75);
  R4(e, a, b, c, d, 76);
  R4(d, e, a, b, c, 77);
  R4(c, d, e, a, b, 78);
  R4(b, c, d, e, a, 79);
  /* Add the working vars back into context.state[] */
  state[0] += a;
  state[1] += b;
  state[2] += c;
  state[3] += d;
  state[4] += e;
  /* Wipe variables */
  a = b = c = d = e = 0;
#ifdef SHA1HANDSOFF
  memset(block, '\0', sizeof(block));
#endif
}